

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O2

Result __thiscall spectest::JSONParser::ParseFilename(JSONParser *this,string *out_filename)

{
  Result RVar1;
  string_view filename;
  string sStack_38;
  
  RVar1 = ParseKeyStringValue(this,"filename",out_filename);
  if (RVar1.enum_ != Error) {
    filename._M_str = (out_filename->_M_dataplus)._M_p;
    filename._M_len = out_filename->_M_string_length;
    CreateModulePath_abi_cxx11_(&sStack_38,this,filename);
    std::__cxx11::string::operator=((string *)out_filename,(string *)&sStack_38);
    std::__cxx11::string::_M_dispose();
  }
  return (Result)(uint)(RVar1.enum_ == Error);
}

Assistant:

wabt::Result JSONParser::ParseFilename(std::string* out_filename) {
  PARSE_KEY_STRING_VALUE("filename", out_filename);
  *out_filename = CreateModulePath(*out_filename);
  return wabt::Result::Ok;
}